

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

void __thiscall
wasm::SmallVector<wasm::Expression_**,_4UL>::push_back
          (SmallVector<wasm::Expression_**,_4UL> *this,Expression ***x)

{
  pointer *ppppEVar1;
  ulong uVar2;
  Expression **ppEVar3;
  iterator __position;
  
  uVar2 = this->usedFixed;
  if (uVar2 < 4) {
    ppEVar3 = *x;
    this->usedFixed = uVar2 + 1;
    (this->fixed)._M_elems[uVar2] = ppEVar3;
  }
  else {
    __position._M_current =
         (this->flexible).
         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->flexible).
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
      _M_realloc_insert<wasm::Expression**const&>
                ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)&this->flexible,
                 __position,x);
      return;
    }
    *__position._M_current = *x;
    ppppEVar1 = &(this->flexible).
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    *ppppEVar1 = *ppppEVar1 + 1;
  }
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }